

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

string * __thiscall
hgdb::json::JSONWriter::escape_abi_cxx11_
          (string *__return_storage_ptr__,JSONWriter *this,string_view value)

{
  ostream *poVar1;
  stringstream sVar2;
  JSONWriter *pJVar3;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  for (pJVar3 = (JSONWriter *)0x0; this != pJVar3; pJVar3 = (JSONWriter *)&pJVar3->field_0x1) {
    sVar2 = (&pJVar3->s_)[value._M_len];
    poVar1 = local_1a8;
    if (sVar2 == (stringstream)0x5c) {
      poVar1 = std::operator<<(local_1a8,'\\');
      sVar2 = (stringstream)0x5c;
    }
    std::operator<<(poVar1,(char)sVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

static std::string escape(std::string_view value) {
        std::stringstream ss;
        for (auto c : value) {
            if (c == '\\') {
                ss << '\\' << '\\';
            } else {
                ss << c;
            }
        }

        return ss.str();
    }